

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__pic_info(stbi__context *s,int *x,int *y,int *comp)

{
  stbi_uc *psVar1;
  stbi_uc sVar2;
  int iVar3;
  stbi_uc *psVar4;
  stbi_uc *psVar5;
  int iVar6;
  stbi_uc *psVar7;
  stbi_uc sVar8;
  byte bVar9;
  byte bVar10;
  
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
    psVar4 = s->img_buffer;
LAB_00118926:
    s->img_buffer = psVar4 + 0x5c;
  }
  else {
    psVar4 = s->img_buffer;
    iVar6 = (int)s->img_buffer_end - (int)psVar4;
    if (0x5b < iVar6) goto LAB_00118926;
    s->img_buffer = s->img_buffer_end;
    (*(s->io).skip)(s->io_user_data,0x5c - iVar6);
  }
  iVar6 = stbi__get16be(s);
  *x = iVar6;
  iVar6 = stbi__get16be(s);
  *y = iVar6;
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00118966:
    if (s->img_buffer_end <= s->img_buffer) {
      return 0;
    }
  }
  else {
    iVar6 = (*(s->io).eof)(s->io_user_data);
    if (iVar6 != 0) {
      if (s->read_from_callbacks == 0) {
        return 0;
      }
      goto LAB_00118966;
    }
  }
  if ((*x != 0) && ((int)(0x10000000 / (long)*x) < *y)) {
    s->img_buffer = s->img_buffer_original;
    return 0;
  }
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
    psVar4 = s->img_buffer;
  }
  else {
    psVar4 = s->img_buffer;
    iVar6 = (int)s->img_buffer_end - (int)psVar4;
    if (iVar6 < 8) {
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,8 - iVar6);
      goto LAB_001189f2;
    }
  }
  s->img_buffer = psVar4 + 8;
LAB_001189f2:
  psVar4 = s->buffer_start;
  psVar1 = s->buffer_start + 1;
  iVar6 = 0xb;
  bVar9 = 0;
  do {
    iVar6 = iVar6 + -1;
    if (iVar6 == 0) {
      return 0;
    }
    psVar7 = s->img_buffer;
    psVar5 = s->img_buffer_end;
    if (psVar7 < psVar5) {
      s->img_buffer = psVar7 + 1;
      sVar2 = *psVar7;
      psVar7 = psVar7 + 1;
    }
    else if (s->read_from_callbacks == 0) {
      sVar2 = '\0';
    }
    else {
      iVar3 = (*(s->io).read)(s->io_user_data,(char *)psVar4,s->buflen);
      if (iVar3 == 0) {
        s->read_from_callbacks = 0;
        s->buffer_start[0] = '\0';
        sVar2 = '\0';
        psVar5 = psVar1;
      }
      else {
        sVar2 = *psVar4;
        psVar5 = psVar4 + iVar3;
      }
      s->img_buffer_end = psVar5;
      s->img_buffer = psVar1;
      psVar7 = psVar1;
    }
    if (psVar7 < psVar5) {
      s->img_buffer = psVar7 + 1;
      sVar8 = *psVar7;
      psVar7 = psVar7 + 1;
    }
    else if (s->read_from_callbacks == 0) {
      sVar8 = '\0';
    }
    else {
      iVar3 = (*(s->io).read)(s->io_user_data,(char *)psVar4,s->buflen);
      if (iVar3 == 0) {
        s->read_from_callbacks = 0;
        s->buffer_start[0] = '\0';
        sVar8 = '\0';
        psVar5 = psVar1;
      }
      else {
        sVar8 = *psVar4;
        psVar5 = psVar4 + iVar3;
      }
      s->img_buffer_end = psVar5;
      s->img_buffer = psVar1;
      psVar7 = psVar1;
    }
    if (psVar7 < psVar5) {
      psVar7 = psVar7 + 1;
LAB_00118b3b:
      s->img_buffer = psVar7;
    }
    else if (s->read_from_callbacks != 0) {
      iVar3 = (*(s->io).read)(s->io_user_data,(char *)psVar4,s->buflen);
      if (iVar3 == 0) {
        s->read_from_callbacks = 0;
        s->buffer_start[0] = '\0';
        psVar5 = psVar1;
      }
      else {
        psVar5 = psVar4 + iVar3;
      }
      s->img_buffer_end = psVar5;
      psVar7 = psVar1;
      goto LAB_00118b3b;
    }
    if (psVar7 < psVar5) {
      s->img_buffer = psVar7 + 1;
      bVar10 = *psVar7;
      psVar7 = psVar7 + 1;
    }
    else if (s->read_from_callbacks == 0) {
      bVar10 = 0;
    }
    else {
      iVar3 = (*(s->io).read)(s->io_user_data,(char *)psVar4,s->buflen);
      if (iVar3 == 0) {
        s->read_from_callbacks = 0;
        s->buffer_start[0] = '\0';
        bVar10 = 0;
        psVar5 = psVar1;
      }
      else {
        bVar10 = *psVar4;
        psVar5 = psVar4 + iVar3;
      }
      s->img_buffer_end = psVar5;
      s->img_buffer = psVar1;
      psVar7 = psVar1;
    }
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00118bcf:
      if (psVar5 <= psVar7) goto LAB_00118c0f;
    }
    else {
      iVar3 = (*(s->io).eof)(s->io_user_data);
      if (iVar3 != 0) {
        if (s->read_from_callbacks == 0) goto LAB_00118c0f;
        psVar7 = s->img_buffer;
        psVar5 = s->img_buffer_end;
        goto LAB_00118bcf;
      }
    }
    if (sVar8 != '\b') {
LAB_00118c0f:
      s->img_buffer = s->img_buffer_original;
      return 0;
    }
    bVar9 = bVar9 | bVar10;
    if (sVar2 == '\0') {
      *comp = 4 - (uint)((bVar9 & 0x10) == 0);
      return 1;
    }
  } while( true );
}

Assistant:

static int stbi__pic_info(stbi__context *s, int *x, int *y, int *comp)
{
   int act_comp=0,num_packets=0,chained;
   stbi__pic_packet packets[10];

   stbi__skip(s, 92);

   *x = stbi__get16be(s);
   *y = stbi__get16be(s);
   if (stbi__at_eof(s))  return 0;
   if ( (*x) != 0 && (1 << 28) / (*x) < (*y)) {
       stbi__rewind( s );
       return 0;
   }

   stbi__skip(s, 8);

   do {
      stbi__pic_packet *packet;

      if (num_packets==sizeof(packets)/sizeof(packets[0]))
         return 0;

      packet = &packets[num_packets++];
      chained = stbi__get8(s);
      packet->size    = stbi__get8(s);
      packet->type    = stbi__get8(s);
      packet->channel = stbi__get8(s);
      act_comp |= packet->channel;

      if (stbi__at_eof(s)) {
          stbi__rewind( s );
          return 0;
      }
      if (packet->size != 8) {
          stbi__rewind( s );
          return 0;
      }
   } while (chained);

   *comp = (act_comp & 0x10 ? 4 : 3);

   return 1;
}